

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

PropertyBase *
Protocol::MQTT::V5::
TypedProperty<(Protocol::MQTT::V5::PropertyType)8,_Protocol::MQTT::Common::DynamicString>::
allocateProp(void)

{
  PropertyBase *this;
  DynamicString local_28;
  
  this = (PropertyBase *)operator_new(0x30);
  local_28.super_Serializable._vptr_Serializable = (_func_int **)&PTR_getSize_00124388;
  local_28.length = 0;
  local_28.data = (char *)0x0;
  Property<Protocol::MQTT::Common::DynamicString>::Property
            ((Property<Protocol::MQTT::Common::DynamicString> *)this,ResponseTopic,&local_28,true);
  free(local_28.data);
  return this;
}

Assistant:

static PropertyBase * allocateProp() { return new Property<T>(type, T(), true) ; }